

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateExtraDefaultFields
          (MessageGenerator *this,Printer *printer)

{
  FieldDescriptor *this_00;
  Type TVar1;
  CType CVar2;
  FieldGenerator *pFVar3;
  Descriptor *pDVar4;
  FieldDescriptor *extraout_RDX;
  FieldDescriptor *field;
  FieldDescriptor *extraout_RDX_00;
  FieldDescriptor *extraout_RDX_01;
  long lVar5;
  long lVar6;
  long lVar7;
  string local_50;
  
  if ((0 < *(int *)(this->descriptor_ + 0x38)) || (0 < this->num_weak_fields_)) {
    io::Printer::Print(printer,"public:\n");
    pDVar4 = this->descriptor_;
    field = extraout_RDX;
    if (0 < *(int *)(pDVar4 + 0x38)) {
      field = (FieldDescriptor *)0x0;
      do {
        lVar6 = *(long *)(pDVar4 + 0x40);
        lVar5 = (long)field * 0x30;
        if (0 < *(int *)(lVar6 + 0x1c + lVar5)) {
          lVar7 = 0;
          do {
            this_00 = *(FieldDescriptor **)(*(long *)(lVar6 + 0x20 + lVar5) + lVar7 * 8);
            TVar1 = FieldDescriptor::type(this_00);
            if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)TVar1 * 4) == 10) {
LAB_0025479f:
              io::Printer::Print(printer,"const ");
            }
            else {
              TVar1 = FieldDescriptor::type(this_00);
              if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)TVar1 * 4) == 9) {
                CVar2 = EffectiveStringCType(this_00);
                if (CVar2 != FieldOptions_CType_STRING) goto LAB_0025479f;
              }
            }
            pFVar3 = FieldGeneratorMap::get(&this->field_generators_,this_00);
            (*pFVar3->_vptr_FieldGenerator[2])(pFVar3,printer);
            lVar7 = lVar7 + 1;
            pDVar4 = this->descriptor_;
            lVar6 = *(long *)(pDVar4 + 0x40);
          } while (lVar7 < *(int *)(lVar6 + 0x1c + lVar5));
        }
        field = field + 1;
      } while ((long)field < (long)*(int *)(pDVar4 + 0x38));
    }
    if (0 < *(int *)(pDVar4 + 0x2c)) {
      lVar5 = 0;
      lVar6 = 0;
      do {
        if (*(char *)(*(long *)(*(long *)(pDVar4 + 0x30) + 0x80 + lVar5) + 0x6f) == '\x01') {
          FieldName_abi_cxx11_(&local_50,(cpp *)(*(long *)(pDVar4 + 0x30) + lVar5),field);
          io::Printer::Print(printer,"  const ::google::protobuf::Message* $name$_;\n","name",
                             &local_50);
          field = extraout_RDX_00;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
            field = extraout_RDX_01;
          }
          pDVar4 = this->descriptor_;
        }
        lVar6 = lVar6 + 1;
        lVar5 = lVar5 + 0xa8;
      } while (lVar6 < *(int *)(pDVar4 + 0x2c));
    }
  }
  return;
}

Assistant:

void MessageGenerator::
GenerateExtraDefaultFields(io::Printer* printer) {
  // Generate oneof default instance and weak field instances for reflection
  // usage.
  if (descriptor_->oneof_decl_count() > 0 || num_weak_fields_ > 0) {
    printer->Print("public:\n");
    for (int i = 0; i < descriptor_->oneof_decl_count(); i++) {
      for (int j = 0; j < descriptor_->oneof_decl(i)->field_count(); j++) {
        const FieldDescriptor* field = descriptor_->oneof_decl(i)->field(j);
        if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE ||
            (field->cpp_type() == FieldDescriptor::CPPTYPE_STRING &&
             EffectiveStringCType(field) != FieldOptions::STRING)) {
          printer->Print("const ");
        }
        field_generators_.get(field).GeneratePrivateMembers(printer);
      }
    }
    for (int i = 0; i < descriptor_->field_count(); i++) {
      const FieldDescriptor* field = descriptor_->field(i);
      if (field->options().weak()) {
        printer->Print(
            "  const ::google::protobuf::Message* $name$_;\n", "name", FieldName(field));
      }
    }
  }
}